

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hair_geometry_device.cpp
# Opt level: O1

void device_init(char *cfg)

{
  embree::data = (RTCScene)0x0;
  _DAT_002cfd78 = 0;
  _DAT_002cfd80 = g_ispc_scene;
  _DAT_002cfd90 = g_dirlight_direction.field_0._0_8_;
  uRam00000000002cfd98 = g_dirlight_direction.field_0._8_8_;
  _DAT_002cfda0 = g_dirlight_intensity.field_0._0_8_;
  uRam00000000002cfda8 = g_dirlight_intensity.field_0._8_8_;
  _DAT_002cfdb0 = g_ambient_intensity.field_0._0_8_;
  uRam00000000002cfdb8 = g_ambient_intensity.field_0._8_8_;
  DAT_002cfdc0 = 0;
  _DAT_002cfdc8 = 0;
  _DAT_002cfdd0 = 0;
  _DAT_002cfde0 = 0;
  uRam00000000002cfde8 = 0;
  _DAT_002cfdf0 = 0;
  uRam00000000002cfdf8 = 0;
  _DAT_002cfe00 = 0;
  uRam00000000002cfe08 = 0;
  _DAT_002cfe10 = 0;
  uRam00000000002cfe18 = 0;
  DAT_002cfe20 = 0;
  _DAT_002cfe30 = 0x3f11eb853f4ccccd;
  uRam00000000002cfe38 = 0x3ea3d70a;
  _DAT_002cfe40 = 0x3df5c28f3dcccccd;
  uRam00000000002cfe48 = 0x3da3d70a;
  _DAT_002cfe50 = 0x3de978d53e23d70b;
  uRam00000000002cfe58 = 0x3d83126f;
  _DAT_002cfe60 = 0x3ee978d53f23d70b;
  uRam00000000002cfe68 = 0x3e83126f;
  embree::g_scene = embree::convertScene(g_ispc_scene);
  embree::data = embree::g_scene;
  _DAT_002cfd78 = rtcGetSceneTraversable(embree::g_scene);
  return;
}

Assistant:

void device_init (char* cfg)
{
  TutorialData_Constructor(&data);
  
  /* create scene */
  g_scene = data.scene = convertScene(data.ispc_scene);
  data.traversable = rtcGetSceneTraversable(data.scene);
}